

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O2

void __thiscall
coinscachepair_tests::linked_list_add_flags::test_method(linked_list_add_flags *this)

{
  long lVar1;
  CCoinsCacheEntry *pCVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  CoinsCachePair **ppCVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  CoinsCachePair *local_218;
  undefined8 local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined **local_1c8;
  undefined1 local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CoinsCachePair n2;
  pair<const_COutPoint,_CCoinsCacheEntry> local_118;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&sentinel);
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_next = &sentinel;
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&local_118);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>(&n2);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d0 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)((ulong)local_210._4_4_ << 0x20);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_1c8,&local_1d8,0x97,1,2,&local_218,"n1.second.GetFlags()",&local_210,"0");
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x98;
  file_00.m_begin = (iterator)&local_1e8;
  msg_00.m_end = (iterator)ppCVar5;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f8,
             msg_00);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_200 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_208,0x98,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&sentinel");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x99;
  file_01.m_begin = (iterator)&local_228;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_238,
             msg_01);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_240 = "";
  local_210 = sentinel.second.m_prev;
  local_218 = &sentinel;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_248,0x99,1,2,&local_210,"sentinel.second.Prev()",&local_218,
             "&sentinel");
  if (local_118.second.m_flags == 0) {
    local_118.second.m_prev = sentinel.second.m_prev;
    local_118.second.m_next = &sentinel;
    pCVar2 = &(sentinel.second.m_prev)->second;
    sentinel.second.m_prev = &local_118;
    pCVar2->m_next = &local_118;
  }
  local_118.second.m_flags = local_118.second.m_flags | 1;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_258;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_268,
             msg_02);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_270 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)CONCAT44(local_210._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_1c8,&local_278,0x9d,1,2,&local_218,"n1.second.GetFlags()",&local_210,
             "CCoinsCacheEntry::DIRTY");
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9e;
  file_03.m_begin = (iterator)&local_288;
  msg_03.m_end = (iterator)ppCVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_298,
             msg_03);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2a0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_2a8,0x9e,1,2,pvVar3,"n1.second.Next()",&local_218,"&sentinel");
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9f;
  file_04.m_begin = (iterator)&local_2b8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c8,
             msg_04);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2d0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_prev;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_2d8,0x9f,1,2,pvVar3,"n1.second.Prev()",&local_218,"&sentinel");
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa0;
  file_05.m_begin = (iterator)&local_2e8;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2f8,
             msg_05);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_300 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &local_118;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_308,0xa0,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n1");
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa1;
  file_06.m_begin = (iterator)&local_318;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_328,
             msg_06);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_330 = "";
  local_210 = sentinel.second.m_prev;
  local_218 = &local_118;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_338,0xa1,1,2,&local_210,"sentinel.second.Prev()",&local_218,"&n1");
  if (n2.second.m_flags == '\0') {
    n2.second.m_prev = sentinel.second.m_prev;
    n2.second.m_next = &sentinel;
    ((sentinel.second.m_prev)->second).m_next = &n2;
    sentinel.second.m_prev = &n2;
  }
  n2.second.m_flags = n2.second.m_flags | 2;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa5;
  file_07.m_begin = (iterator)&local_348;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_358,
             msg_07);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_360 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,n2.second.m_flags);
  local_210 = (CoinsCachePair *)CONCAT44(local_210._4_4_,2);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_1c8,&local_368,0xa5,1,2,&local_218,"n2.second.GetFlags()",&local_210,
             "CCoinsCacheEntry::FRESH");
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xa6;
  file_08.m_begin = (iterator)&local_378;
  msg_08.m_end = (iterator)ppCVar5;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_388,
             msg_08);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_390 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_398,0xa6,1,2,pvVar3,"n2.second.Next()",&local_218,"&sentinel");
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xa7;
  file_09.m_begin = (iterator)&local_3a8;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3b8,
             msg_09);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3c0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_prev;
  local_218 = &local_118;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_3c8,0xa7,1,2,pvVar3,"n2.second.Prev()",&local_218,"&n1");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa8;
  file_10.m_begin = (iterator)&local_3d8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8,
             msg_10);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3f0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_3f8,0xa8,1,2,pvVar3,"n1.second.Next()",&local_218,"&n2");
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa9;
  file_11.m_begin = (iterator)&local_408;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_418,
             msg_11);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_420 = "";
  local_210 = sentinel.second.m_prev;
  local_218 = &n2;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_428,0xa9,1,2,&local_210,"sentinel.second.Prev()",&local_218,"&n2");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xad;
  file_12.m_begin = (iterator)&local_438;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_448,
             msg_12);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_450 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)CONCAT44(local_210._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_1c8,&local_458,0xad,1,2,&local_218,"n1.second.GetFlags()",&local_210,
             "CCoinsCacheEntry::DIRTY");
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xae;
  file_13.m_begin = (iterator)&local_468;
  msg_13.m_end = (iterator)ppCVar5;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_478,
             msg_13);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_480 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_488,0xae,1,2,pvVar3,"n1.second.Next()",&local_218,"&n2");
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xaf;
  file_14.m_begin = (iterator)&local_498;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4a8,
             msg_14);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4b0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_prev;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_4b8,0xaf,1,2,pvVar3,"n1.second.Prev()",&local_218,"&sentinel");
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb0;
  file_15.m_begin = (iterator)&local_4c8;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4d8,
             msg_15);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4e0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &local_118;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_4e8,0xb0,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n1");
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb1;
  file_16.m_begin = (iterator)&local_4f8;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_508,
             msg_16);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_510 = "";
  local_210 = n2.second.m_prev;
  local_218 = &local_118;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_518,0xb1,1,2,&local_210,"n2.second.Prev()",&local_218,"&n1");
  if (local_118.second.m_flags == 0) {
    local_118.second.m_prev = sentinel.second.m_prev;
    local_118.second.m_next = &sentinel;
    ((sentinel.second.m_prev)->second).m_next = &local_118;
    sentinel.second.m_prev = &local_118;
  }
  local_118.second.m_flags = local_118.second.m_flags | 2;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb5;
  file_17.m_begin = (iterator)&local_528;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_538,
             msg_17);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_540 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)CONCAT44(local_210._4_4_,3);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_1c8,&local_548,0xb5,1,2,&local_218,"n1.second.GetFlags()",&local_210,
             "CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH");
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xb6;
  file_18.m_begin = (iterator)&local_558;
  msg_18.m_end = (iterator)ppCVar5;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_568,
             msg_18);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_570 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_578,0xb6,1,2,pvVar3,"n1.second.Next()",&local_218,"&n2");
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb7;
  file_19.m_begin = (iterator)&local_588;
  msg_19.m_end = pvVar3;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_598,
             msg_19);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5a0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_prev;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_5a8,0xb7,1,2,pvVar3,"n1.second.Prev()",&local_218,"&sentinel");
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xb8;
  file_20.m_begin = (iterator)&local_5b8;
  msg_20.m_end = pvVar3;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_5c8,
             msg_20);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5d0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &local_118;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_5d8,0xb8,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n1");
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xb9;
  file_21.m_begin = (iterator)&local_5e8;
  msg_21.m_end = pvVar3;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5f8,
             msg_21);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_600 = "";
  local_210 = n2.second.m_prev;
  local_218 = &local_118;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_608,0xb9,1,2,&local_210,"n2.second.Prev()",&local_218,"&n1");
  if (local_118.second.m_flags != 0) {
    ((local_118.second.m_next)->second).m_prev = local_118.second.m_prev;
    ((local_118.second.m_prev)->second).m_next = local_118.second.m_next;
    local_118.second.m_flags = 0;
  }
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xbd;
  file_22.m_begin = (iterator)&local_618;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_628,
             msg_22);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_630 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)((ulong)local_210 & 0xffffffff00000000);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_1c8,&local_638,0xbd,1,2,&local_218,"n1.second.GetFlags()",&local_210,"0");
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xbe;
  file_23.m_begin = (iterator)&local_648;
  msg_23.m_end = (iterator)ppCVar5;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_658,
             msg_23);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_660 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_668,0xbe,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n2");
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0xbf;
  file_24.m_begin = (iterator)&local_678;
  msg_24.m_end = pvVar3;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_688,
             msg_24);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_690 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_prev;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_698,0xbf,1,2,pvVar3,"sentinel.second.Prev()",&local_218,"&n2");
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0xc0;
  file_25.m_begin = (iterator)&local_6a8;
  msg_25.m_end = pvVar3;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6b8,
             msg_25);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6c0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_6c8,0xc0,1,2,pvVar3,"n2.second.Next()",&local_218,"&sentinel");
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xc1;
  file_26.m_begin = (iterator)&local_6d8;
  msg_26.m_end = pvVar3;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6e8,
             msg_26);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6f0 = "";
  local_210 = n2.second.m_prev;
  local_218 = &sentinel;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_6f8,0xc1,1,2,&local_210,"n2.second.Prev()",&local_218,"&sentinel");
  if (local_118.second.m_flags != 0) {
    ((local_118.second.m_next)->second).m_prev = local_118.second.m_prev;
    ((local_118.second.m_prev)->second).m_next = local_118.second.m_next;
    local_118.second.m_flags = 0;
  }
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xc5;
  file_27.m_begin = (iterator)&local_708;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_718,
             msg_27);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_720 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)((ulong)local_210 & 0xffffffff00000000);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_1c8,&local_728,0xc5,1,2,&local_218,"n1.second.GetFlags()",&local_210,"0");
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xc6;
  file_28.m_begin = (iterator)&local_738;
  msg_28.m_end = (iterator)ppCVar5;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_748,
             msg_28);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_750 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_758,0xc6,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n2");
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xc7;
  file_29.m_begin = (iterator)&local_768;
  msg_29.m_end = pvVar3;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_778,
             msg_29);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_780 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_prev;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_788,199,1,2,pvVar3,"sentinel.second.Prev()",&local_218,"&n2");
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xc8;
  file_30.m_begin = (iterator)&local_798;
  msg_30.m_end = pvVar3;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7a8,
             msg_30);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_7b0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_7b8,200,1,2,pvVar3,"n2.second.Next()",&local_218,"&sentinel");
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0xc9;
  file_31.m_begin = (iterator)&local_7c8;
  msg_31.m_end = pvVar3;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7d8,
             msg_31);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_7e0 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_prev;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_7e8,0xc9,1,2,pvVar3,"n2.second.Prev()",&local_218,"&sentinel");
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xcd;
  file_32.m_begin = (iterator)&local_7f8;
  msg_32.m_end = pvVar3;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_808,
             msg_32);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_810 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_next;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_818,0xcd,1,2,pvVar3,"sentinel.second.Next()",&local_218,"&n2");
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xce;
  file_33.m_begin = (iterator)&local_828;
  msg_33.m_end = pvVar3;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_838,
             msg_33);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_840 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = sentinel.second.m_prev;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_848,0xce,1,2,pvVar3,"sentinel.second.Prev()",&local_218,"&n2");
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xcf;
  file_34.m_begin = (iterator)&local_858;
  msg_34.m_end = pvVar3;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_868,
             msg_34);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_870 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_878,0xcf,1,2,pvVar3,"n2.second.Next()",&local_218,"&sentinel");
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xd0;
  file_35.m_begin = (iterator)&local_888;
  msg_35.m_end = pvVar3;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_898,
             msg_35);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_8a0 = "";
  local_210 = n2.second.m_prev;
  local_218 = &sentinel;
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)&local_210;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_8a8,0xd0,1,2,&local_210,"n2.second.Prev()",&local_218,"&sentinel");
  if (local_118.second.m_flags == 0) {
    local_118.second.m_prev = sentinel.second.m_prev;
    local_118.second.m_next = &sentinel;
    ((sentinel.second.m_prev)->second).m_next = &local_118;
    sentinel.second.m_prev = &local_118;
  }
  local_118.second.m_flags = local_118.second.m_flags | 1;
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xd4;
  file_36.m_begin = (iterator)&local_8b8;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_8c8,
             msg_36);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_8d0 = "";
  local_218 = (CoinsCachePair *)CONCAT71(local_218._1_7_,local_118.second.m_flags);
  local_210 = (CoinsCachePair *)CONCAT44(local_210._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar5 = &local_218;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_1c8,&local_8d8,0xd4,1,2,&local_218,"n1.second.GetFlags()",&local_210,
             "CCoinsCacheEntry::DIRTY");
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xd5;
  file_37.m_begin = (iterator)&local_8e8;
  msg_37.m_end = (iterator)ppCVar5;
  msg_37.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8f8,
             msg_37);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_900 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = n2.second.m_next;
  local_218 = &local_118;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_908,0xd5,1,2,pvVar3,"n2.second.Next()",&local_218,"&n1");
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xd6;
  file_38.m_begin = (iterator)&local_918;
  msg_38.m_end = pvVar3;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_928,
             msg_38);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_938 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_930 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_prev;
  local_218 = &n2;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_938,0xd6,1,2,pvVar3,"n1.second.Prev()",&local_218,"&n2");
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0xd7;
  file_39.m_begin = (iterator)&local_948;
  msg_39.m_end = pvVar3;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_958,
             msg_39);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_960 = "";
  pvVar3 = (iterator)&local_210;
  local_210 = local_118.second.m_next;
  local_218 = &sentinel;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_968,0xd7,1,2,pvVar3,"n1.second.Next()",&local_218,"&sentinel");
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_970 = "";
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0xd8;
  file_40.m_begin = (iterator)&local_978;
  msg_40.m_end = pvVar3;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_988,
             msg_40);
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_011480b0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_998 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_990 = "";
  local_210 = sentinel.second.m_prev;
  local_218 = &local_118;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_1c8,&local_998,0xd8,1,2,&local_210,"sentinel.second.Prev()",&local_218,"&n1");
  CCoinsCacheEntry::~CCoinsCacheEntry(&n2.second);
  CCoinsCacheEntry::~CCoinsCacheEntry(&local_118.second);
  CCoinsCacheEntry::~CCoinsCacheEntry(&sentinel.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_add_flags)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    CoinsCachePair n1;
    CoinsCachePair n2;

    // Check that adding 0 flag has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);

    // Check that adding DIRTY flag inserts it into linked list and sets flags
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);

    // Check that adding FRESH flag on new node inserts it after n1
    n2.second.AddFlags(CCoinsCacheEntry::FRESH, n2, sentinel);
    BOOST_CHECK_EQUAL(n2.second.GetFlags(), CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);

    // Check that adding 0 flag has no effect, and doesn't change position
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can add extra flags, but they don't change our position
    n1.second.AddFlags(CCoinsCacheEntry::FRESH, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can clear flags then re-add them
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Check that calling `ClearFlags` with 0 flags has no effect
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Adding 0 still has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // But adding DIRTY re-inserts it after n2
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n2.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);
}